

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::InternalAlloc(PF_BufferMgr *this,int *slot)

{
  PF_BufPageDesc *pPVar1;
  int iVar2;
  RC RVar3;
  PF_BufPageDesc *pPVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = this->free;
  if ((long)iVar5 == -1) {
    iVar5 = this->last;
    *slot = iVar5;
    RVar3 = -2;
    if (iVar5 != -1) {
      pPVar4 = this->bufTable;
      do {
        lVar6 = (long)iVar5;
        pPVar1 = pPVar4 + lVar6;
        if (pPVar4[lVar6].pinCount == 0) {
          if (pPVar1->bDirty != 0) {
            RVar3 = WritePage(this,pPVar1->fd,pPVar1->pageNum,pPVar1->pData);
            if (RVar3 != 0) {
              return RVar3;
            }
            pPVar4 = this->bufTable;
            pPVar4[*slot].bDirty = 0;
            lVar6 = (long)*slot;
          }
          RVar3 = PF_HashTable::Delete(&this->hashTable,pPVar4[lVar6].fd,pPVar4[lVar6].pageNum);
          if (RVar3 != 0) {
            return RVar3;
          }
          Unlink(this,*slot);
          pPVar4 = this->bufTable;
          goto LAB_00105235;
        }
        iVar5 = pPVar1->prev;
        *slot = iVar5;
      } while (iVar5 != -1);
    }
  }
  else {
    *slot = iVar5;
    pPVar4 = this->bufTable;
    this->free = pPVar4[iVar5].next;
LAB_00105235:
    iVar5 = *slot;
    iVar2 = this->first;
    pPVar4[iVar5].next = iVar2;
    pPVar4[iVar5].prev = -1;
    if ((long)iVar2 != -1) {
      pPVar4[iVar2].prev = iVar5;
    }
    this->first = iVar5;
    RVar3 = 0;
    if (this->last == -1) {
      this->last = iVar5;
      RVar3 = 0;
    }
  }
  return RVar3;
}

Assistant:

RC PF_BufferMgr::InternalAlloc(int &slot)
{
   RC  rc;       // return code

   // If the free list is not empty, choose a slot from the free list
   if (free != INVALID_SLOT) {
      slot = free;
      free = bufTable[slot].next;
   }
   else {

      // Choose the least-recently used page that is unpinned
      for (slot = last; slot != INVALID_SLOT; slot = bufTable[slot].prev) {
         if (bufTable[slot].pinCount == 0)
            break;
      }

      // Return error if all buffers were pinned
      if (slot == INVALID_SLOT)
         return (PF_NOBUF);

      // Write out the page if it is dirty
      if (bufTable[slot].bDirty) {
         if ((rc = WritePage(bufTable[slot].fd, bufTable[slot].pageNum,
               bufTable[slot].pData)))
            return (rc);

         bufTable[slot].bDirty = FALSE;
      }

      // Remove page from the hash table and slot from the used buffer list
      if ((rc = hashTable.Delete(bufTable[slot].fd, bufTable[slot].pageNum)) ||
            (rc = Unlink(slot)))
         return (rc);
   }

   // Link slot at the head of the used list
   if ((rc = LinkHead(slot)))
      return (rc);

   // Return ok
   return (0);
}